

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall ColorPrimariesNTSC1953::ColorPrimariesNTSC1953(ColorPrimariesNTSC1953 *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  ColorPrimaryTransform *in_RDI;
  ColorPrimaryTransform *inToXYZ;
  ColorPrimaries *in_stack_fffffffffffffee0;
  allocator_type *in_stack_fffffffffffffef8;
  allocator_type *__a;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff00;
  vector<float,_std::allocator<float>_> *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar1;
  undefined1 in_stack_ffffffffffffff0c [12];
  undefined1 local_89 [49];
  undefined1 *local_58;
  undefined8 local_50;
  
  local_89._17_8_ = 0x3deab9b23f161fb0;
  local_89._25_8_ = 0x3d8752db00000000;
  local_89._1_8_ = 0x3e319c9d3f1b63e5;
  local_89._9_8_ = 0x3e9912343e4d627c;
  local_89._33_4_ = 0x3f8f0939;
  local_58 = local_89 + 1;
  local_50 = 9;
  inToXYZ = (ColorPrimaryTransform *)local_89;
  std::allocator<float>::allocator((allocator<float> *)0x252253);
  __l._4_12_ = in_stack_ffffffffffffff0c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff08;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,__l,in_stack_fffffffffffffef8);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  __a = (allocator_type *)0xbce7f90e3ffff8b1;
  this_00 = (vector<float,_std::allocator<float>_> *)0xbdf22af53d6e8e1d;
  uVar1 = 0x3f658490;
  std::allocator<float>::allocator((allocator<float> *)0x2522cf);
  __l_00._4_12_ = in_stack_ffffffffffffff0c;
  __l_00._M_array._0_4_ = uVar1;
  std::vector<float,_std::allocator<float>_>::vector(this_00,__l_00,__a);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  ColorPrimaries::ColorPrimaries(in_stack_fffffffffffffee0,inToXYZ,in_RDI);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x252325);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x25233f);
  return;
}

Assistant:

ColorPrimariesNTSC1953() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.606993f, +0.173449f, +0.200571f,
            +0.298967f, +0.586421f, +0.114612f,
            +0.000000f, +0.066076f, +1.117469f
        }),
        ColorPrimaryTransform({
            +1.909675f, -0.532365f, -0.288161f,
            -0.984965f, +1.999777f, -0.028317f,
            +0.058241f, -0.118246f, +0.896554f
        })
    ) {}